

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

Result<wasm::Ok> *
wasm::WATParser::makeAtomicNotify<wasm::WATParser::NullCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,NullCtx *ctx,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  __index_type *__return_storage_ptr___00;
  Ok *pOVar1;
  bool bVar2;
  Err local_130;
  Err *local_110;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> arg;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  MaybeResult<wasm::Ok> _val;
  MaybeResult<wasm::Ok> mem;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  NullCtx *ctx_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
  maybeMemidx<wasm::WATParser::NullCtx>((MaybeResult<wasm::Ok> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Ok>::MaybeResult
            ((MaybeResult<wasm::Ok> *)local_78,(MaybeResult<wasm::Ok> *)__return_storage_ptr___00);
  local_90 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)local_78);
  bVar2 = local_90 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_b0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_78);
  if (bVar2) {
    memarg<wasm::WATParser::NullCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx,4);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_1,
               (Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_110 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    bVar2 = local_110 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_130,local_110);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_130);
      wasm::Err::~Err(&local_130);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (bVar2) {
      pOVar1 = MaybeResult<wasm::Ok>::getPtr
                         ((MaybeResult<wasm::Ok> *)
                          ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      Result<wasm::Ok>::operator*
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      NullInstrParserCtx::makeAtomicNotify
                (__return_storage_ptr__,(NullInstrParserCtx *)ctx,pos,annotations,pOVar1);
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  MaybeResult<wasm::Ok>::~MaybeResult
            ((MaybeResult<wasm::Ok> *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeAtomicNotify(Ctx& ctx,
                          Index pos,
                          const std::vector<Annotation>& annotations) {
  auto mem = maybeMemidx(ctx);
  CHECK_ERR(mem);
  auto arg = memarg(ctx, 4);
  CHECK_ERR(arg);
  return ctx.makeAtomicNotify(pos, annotations, mem.getPtr(), *arg);
}